

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall util::format<char_const*>(string *__return_storage_ptr__,util *this,char *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  string local_60;
  string local_40;
  undefined1 local_19;
  util *local_18;
  char *arg_local;
  string *s;
  
  local_19 = 0;
  local_18 = this;
  arg_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,(char *)this,&local_61);
  to_string(&local_40,&local_60);
  format_abi_cxx11_();
  std::operator+(__return_storage_ptr__,&local_40,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}